

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_buffer_allocator.cpp
# Opt level: O2

UndoBufferReference * __thiscall
duckdb::UndoBufferAllocator::Allocate
          (UndoBufferReference *__return_storage_ptr__,UndoBufferAllocator *this,idx_t alloc_len)

{
  unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true> *__u;
  idx_t iVar1;
  BufferManager *pBVar2;
  templated_unique_single_t tVar3;
  int iVar4;
  pointer pUVar5;
  undefined4 extraout_var;
  ulong uVar7;
  type pUVar8;
  unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_> __p;
  templated_unique_single_t entry;
  BufferHandle local_78;
  BufferHandle handle;
  BufferHandle local_48;
  ulong uVar6;
  
  BufferHandle::BufferHandle(&handle);
  __u = &this->head;
  if ((this->head).
      super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>._M_t.
      super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
      .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl !=
      (UndoBufferEntry *)0x0) {
    pUVar5 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
             ::operator->(__u);
    iVar1 = pUVar5->position;
    pUVar5 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
             ::operator->(__u);
    if (iVar1 + alloc_len <= pUVar5->capacity) {
      pBVar2 = this->buffer_manager;
      pUVar5 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
               ::operator->(__u);
      (*pBVar2->_vptr_BufferManager[7])(&local_78,pBVar2,&pUVar5->block);
      BufferHandle::operator=(&handle,&local_78);
      BufferHandle::~BufferHandle(&local_78);
      goto LAB_00582e90;
    }
  }
  iVar4 = (*this->buffer_manager->_vptr_BufferManager[0xf])();
  uVar6 = CONCAT44(extraout_var,iVar4);
  uVar7 = 0x1000;
  if ((__u->super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
      )._M_t.
      super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
      .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl !=
      (UndoBufferEntry *)0x0) {
    uVar7 = uVar6;
  }
  if (0x1000 < alloc_len) {
    uVar7 = uVar6;
  }
  if (uVar7 < alloc_len) {
    uVar7 = NextPowerOfTwo(alloc_len);
  }
  make_uniq<duckdb::UndoBufferEntry,duckdb::BufferManager&>((duckdb *)&entry,this->buffer_manager);
  if (uVar7 < uVar6) {
    (*this->buffer_manager->_vptr_BufferManager[0x13])(&local_78,this->buffer_manager,0xc,uVar7);
    pUVar5 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
             ::operator->(&entry);
    shared_ptr<duckdb::BlockHandle,_true>::operator=(&pUVar5->block,&local_78.handle);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_78.handle.internal.
                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    pBVar2 = this->buffer_manager;
    pUVar5 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
             ::operator->(&entry);
    (*pBVar2->_vptr_BufferManager[7])(&local_78,pBVar2,&pUVar5->block);
    BufferHandle::operator=(&handle,&local_78);
    BufferHandle::~BufferHandle(&local_78);
  }
  else {
    (*this->buffer_manager->_vptr_BufferManager[4])(&local_78,this->buffer_manager,0xc,uVar7,0);
    BufferHandle::operator=(&handle,&local_78);
    BufferHandle::~BufferHandle(&local_78);
    pUVar5 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
             ::operator->(&entry);
    shared_ptr<duckdb::BlockHandle,_true>::operator=(&pUVar5->block,&handle.handle);
  }
  pUVar5 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>::
           operator->(&entry);
  pUVar5->capacity = uVar7;
  pUVar5 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>::
           operator->(&entry);
  tVar3 = entry;
  pUVar5->position = 0;
  if ((__u->super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
      )._M_t.
      super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
      .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl ==
      (UndoBufferEntry *)0x0) {
    (this->tail).ptr =
         (UndoBufferEntry *)
         entry.
         super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
         .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl;
    __p._M_t.
    super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
    .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true,_true>
          )(__uniq_ptr_data<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true,_true>
            )entry;
  }
  else {
    pUVar5 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
             ::operator->(__u);
    (pUVar5->prev).ptr =
         (UndoBufferEntry *)
         tVar3.
         super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
         .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl;
    pUVar5 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
             ::operator->(&entry);
    ::std::__uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>::
    operator=((__uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
               *)&pUVar5->next,
              (__uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
               *)__u);
    __p._M_t.
    super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
    .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true,_true>
          )(__uniq_ptr_data<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true,_true>
            )entry;
  }
  entry.super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>.
  _M_t.super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>.
  super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl =
       (unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>)
       (__uniq_ptr_data<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true,_true>
        )0x0;
  ::std::__uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>::
  reset((__uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_> *)
        __u,(pointer)__p._M_t.
                     super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
                     .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl);
  ::std::unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>::
  ~unique_ptr(&entry.
               super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
             );
LAB_00582e90:
  pUVar5 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>::
           operator->(__u);
  iVar1 = pUVar5->position;
  pUVar5 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>::
           operator->(__u);
  pUVar5->position = pUVar5->position + alloc_len;
  pUVar8 = unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>::
           operator*(__u);
  BufferHandle::BufferHandle(&local_48,&handle);
  (__return_storage_ptr__->entry).ptr = pUVar8;
  BufferHandle::BufferHandle(&__return_storage_ptr__->handle,&local_48);
  __return_storage_ptr__->position = iVar1;
  BufferHandle::~BufferHandle(&local_48);
  BufferHandle::~BufferHandle(&handle);
  return __return_storage_ptr__;
}

Assistant:

UndoBufferReference UndoBufferAllocator::Allocate(idx_t alloc_len) {
	D_ASSERT(!head || head->position <= head->capacity);
	BufferHandle handle;
	if (!head || head->position + alloc_len > head->capacity) {
		// no space in current head - allocate a new block
		auto block_size = buffer_manager.GetBlockSize();
		;
		idx_t capacity;
		if (!head && alloc_len <= 4096) {
			capacity = 4096;
		} else {
			capacity = block_size;
		}
		if (capacity < alloc_len) {
			capacity = NextPowerOfTwo(alloc_len);
		}
		auto entry = make_uniq<UndoBufferEntry>(buffer_manager);
		if (capacity < block_size) {
			entry->block = buffer_manager.RegisterSmallMemory(MemoryTag::TRANSACTION, capacity);
			handle = buffer_manager.Pin(entry->block);
		} else {
			handle = buffer_manager.Allocate(MemoryTag::TRANSACTION, capacity, false);
			entry->block = handle.GetBlockHandle();
		}
		entry->capacity = capacity;
		entry->position = 0;
		// add block to the chain
		if (head) {
			head->prev = entry.get();
			entry->next = std::move(head);
		} else {
			tail = entry.get();
		}
		head = std::move(entry);
	} else {
		handle = buffer_manager.Pin(head->block);
	}
	idx_t current_position = head->position;
	head->position += alloc_len;
	return UndoBufferReference(*head, std::move(handle), current_position);
}